

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.h
# Opt level: O2

LispPTR GetSmallp(long x)

{
  if (x < 0) {
    if (0xfffffffffffeffff < (ulong)x) {
      return (uint)x & 0xfffff;
    }
  }
  else if ((ulong)x < 0x10000) {
    return (uint)x | 0xe0000;
  }
  error("Not Smallp data");
  return 0xe0000;
}

Assistant:

static inline LispPTR GetSmallp(long x) {
  if (x >= 0) {
    if (x <= MAX_SMALL) return (LispPTR)(S_POSITIVE | x);
  } else {
    if (x >= MIN_SMALL) return (LispPTR)(S_NEGATIVE | (x & 0xFFFF));
  }
  error("Not Smallp data");
  return (S_POSITIVE | 0);
}